

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

void __thiscall xscript::tokenizer::scanner::step_to_eonb(scanner *this)

{
  byte *pbVar1;
  ulong __pos;
  
  __pos = this->offset;
  while( true ) {
    if ((this->source)._M_len <= __pos) {
      return;
    }
    pbVar1 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::at(&this->source,__pos);
    if ((*pbVar1 & 0xfe) != 0x30) break;
    __pos = this->offset + 1;
    this->offset = __pos;
  }
  return;
}

Assistant:

void scanner::step_to_eonb() {
    while (offset < source.length()) {
        char n = source.at(offset);
        if ( n >= '0' && n <= '1' ) {
            offset++;
        } else {
            break;
        }
    }
}